

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_status<int,_5,_trng::mrg5s> *S)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  int *in_RSI;
  wistream *in_RDI;
  int i;
  fmtflags flags;
  mrg_status<int,_5,_trng::mrg5s> S_new;
  delim_c *in_stack_ffffffffffffffa8;
  wistream *d;
  wistream *in_stack_ffffffffffffffb0;
  int local_30;
  mrg_status<int,_5,_trng::mrg5s> local_24;
  int *local_10;
  wistream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_status<int,_5,_trng::mrg5s>::mrg_status(&local_24);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    std::wistream::operator>>(local_8,local_24.r + local_30);
    if (local_30 + 1 < 5) {
      in_stack_ffffffffffffffb0 = local_8;
      utility::delim('\0');
      utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  d = local_8;
  utility::delim('\0');
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                      in_stack_ffffffffffffffb0,(delim_c *)d);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *(undefined8 *)local_10 = local_24.r._0_8_;
    *(undefined8 *)(local_10 + 2) = local_24.r._8_8_;
    local_10[4] = local_24.r[4];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }